

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O0

void assert_double_equal_(char *file,int line,char *expression,double tried,double expected)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  TestReporter *pTVar5;
  undefined8 in_RDX;
  int in_ESI;
  char *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_stack_ffffffffffffffbc;
  
  pTVar5 = get_test_reporter();
  p_Var1 = pTVar5->assert_true;
  pTVar5 = get_test_reporter();
  _Var2 = doubles_are_equal((double)CONCAT44(in_stack_ffffffffffffffbc,in_ESI),(double)in_RDI);
  uVar3 = (uint)_Var2;
  iVar4 = get_significant_figures();
  (*p_Var1)(pTVar5,in_RDI,in_ESI,uVar3,
            "[%s] should be [%f] within %d significant figures but was [%f]\n",in_XMM1_Qa,in_XMM0_Qa
            ,in_RDX,iVar4);
  return;
}

Assistant:

void assert_double_equal_(const char *file, int line, const char *expression, double tried, double expected) {
    (*get_test_reporter()->assert_true)(
            get_test_reporter(),
            file,
            line,
            doubles_are_equal(tried, expected),
            "[%s] should be [%f] within %d significant figures but was [%f]\n", expression, expected, get_significant_figures(), tried);
}